

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jp2_cod.c
# Opt level: O0

void jp2_box_dump(jp2_box_t *box,FILE *out)

{
  jp2_boxinfo_t *pjVar1;
  jp2_boxinfo_t *boxinfo;
  FILE *out_local;
  jp2_box_t *box_local;
  
  pjVar1 = jp2_boxinfolookup((int)box->type);
  if (pjVar1 != (jp2_boxinfo_t *)0x0) {
    fprintf((FILE *)out,"JP2 box: ");
    fprintf((FILE *)out,"type=%c%s%c (0x%08lx); length=%lu\n",0x22,pjVar1->name,0x22,box->type,
            box->len);
    if (box->ops->dumpdata != (_func_void_jp2_box_t_ptr_FILE_ptr *)0x0) {
      (*box->ops->dumpdata)(box,out);
    }
    return;
  }
  __assert_fail("boxinfo",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/jp2/jp2_cod.c"
                ,0x15d,"void jp2_box_dump(jp2_box_t *, FILE *)");
}

Assistant:

void jp2_box_dump(jp2_box_t *box, FILE *out)
{
	const jp2_boxinfo_t *boxinfo;
	boxinfo = jp2_boxinfolookup(box->type);
	assert(boxinfo);

	fprintf(out, "JP2 box: ");
	fprintf(out, "type=%c%s%c (0x%08"PRIxFAST32"); length=%"PRIuFAST32"\n", '"',
	  boxinfo->name, '"', box->type, box->len);
	if (box->ops->dumpdata) {
		(*box->ops->dumpdata)(box, out);
	}
}